

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::propagateFrom(Solver *this,PostPropagator *p)

{
  int iVar1;
  bool bVar2;
  PostPropagator *pPVar3;
  PostPropagator **ppPVar4;
  PostPropagator **ppPVar5;
  PostPropagator *pPVar6;
  
  ppPVar4 = this->postHead_;
  pPVar3 = *ppPVar4;
  bVar2 = true;
  if (pPVar3 != (PostPropagator *)0x0) {
    if (pPVar3 != p) {
      do {
        pPVar6 = pPVar3;
        pPVar3 = pPVar6->next;
        if (pPVar3 == (PostPropagator *)0x0) {
          return true;
        }
      } while (pPVar3 != p);
      ppPVar4 = &pPVar6->next;
    }
    iVar1 = (*(pPVar3->super_Constraint)._vptr_Constraint[0x14])(pPVar3,this,0);
    if ((char)iVar1 != '\0') {
      do {
        ppPVar5 = &pPVar3->next;
        if (pPVar3 != *ppPVar4) {
          ppPVar5 = ppPVar4;
        }
        pPVar3 = *ppPVar5;
        if (pPVar3 == (PostPropagator *)0x0) {
          return true;
        }
        iVar1 = (*(pPVar3->super_Constraint)._vptr_Constraint[0x14])(pPVar3,this,0);
        ppPVar4 = ppPVar5;
      } while ((char)iVar1 != '\0');
      if (pPVar3 == (PostPropagator *)0x0) {
        return true;
      }
    }
    (this->assign_).front = (this->assign_).trail.ebo_.size;
    for (pPVar3 = *this->postHead_; pPVar3 != (PostPropagator *)0x0; pPVar3 = pPVar3->next) {
      (*(pPVar3->super_Constraint)._vptr_Constraint[0x15])(pPVar3);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Solver::propagateFrom(PostPropagator* p) {
	assert((p && *postHead_) && "OP not allowed during init!");
	assert(queueSize() == 0);
	for (PostPropagator** r = postHead_; *r;) {
		if      (*r != p)             { r = &(*r)->next; }
		else if (postPropagate(r, 0)) { break; }
		else {
			cancelPropagation();
			return false;
		}
	}
	assert(queueSize() == 0);
	return true;
}